

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void common_batch_add(llama_batch *batch,llama_token id,llama_pos pos,
                     vector<int,_std::allocator<int>_> *seq_ids,bool logits)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  int *in_RDI;
  byte in_R8B;
  size_t i;
  ulong local_28;
  
  if (*(long *)(*(long *)(in_RDI + 10) + (long)*in_RDI * 8) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
               ,0x487,"GGML_ASSERT(%s) failed",
               "batch.seq_id[batch.n_tokens] && \"llama_batch size exceeded\"");
  }
  *(undefined4 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 4) = in_ESI;
  *(undefined4 *)(*(long *)(in_RDI + 6) + (long)*in_RDI * 4) = in_EDX;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  *(int *)(*(long *)(in_RDI + 8) + (long)*in_RDI * 4) = (int)sVar1;
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
    if (sVar1 <= local_28) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,local_28);
    *(value_type *)(*(long *)(*(long *)(in_RDI + 10) + (long)*in_RDI * 8) + local_28 * 4) = *pvVar2;
    local_28 = local_28 + 1;
  }
  *(byte *)(*(long *)(in_RDI + 0xc) + (long)*in_RDI) = in_R8B & 1;
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void common_batch_add(
                 struct llama_batch & batch,
                        llama_token   id,
                          llama_pos   pos,
    const std::vector<llama_seq_id> & seq_ids,
                               bool   logits) {
    GGML_ASSERT(batch.seq_id[batch.n_tokens] && "llama_batch size exceeded");

    batch.token   [batch.n_tokens] = id;
    batch.pos     [batch.n_tokens] = pos;
    batch.n_seq_id[batch.n_tokens] = seq_ids.size();
    for (size_t i = 0; i < seq_ids.size(); ++i) {
        batch.seq_id[batch.n_tokens][i] = seq_ids[i];
    }
    batch.logits  [batch.n_tokens] = logits;

    batch.n_tokens++;
}